

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

int vrna_strcat_vprintf(char **dest,char *format,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  va_list copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  uVar2 = 0xffffffff;
  if (format != (char *)0x0 && dest != (char **)0x0) {
    local_38 = args->reg_save_area;
    local_48._0_4_ = args->gp_offset;
    local_48._4_4_ = args->fp_offset;
    pvStack_40 = args->overflow_arg_area;
    pcVar4 = *dest;
    if (pcVar4 == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(pcVar4);
    }
    uVar1 = vsnprintf((char *)0x0,0,format,args);
    uVar6 = (uint)sVar3;
    uVar5 = uVar6;
    uVar2 = uVar1;
    if ((ulong)(long)(int)uVar1 < sVar3) {
      uVar5 = uVar1;
      uVar2 = uVar6;
    }
    if (((uVar1 == 0) || (uVar2 == 0xffffffff)) || (~uVar2 <= uVar5)) {
      uVar2 = -(uint)(uVar1 != 0) | uVar6;
    }
    else {
      pcVar4 = (char *)vrna_realloc(pcVar4,uVar6 + uVar1 + 1);
      if (pcVar4 == (char *)0x0) {
        uVar2 = 0xffffffff;
      }
      else {
        uVar2 = vsnprintf(pcVar4 + sVar3,(long)(int)uVar1 + 1,format,&local_48);
        if ((int)uVar2 < 0) {
          free(pcVar4);
        }
        else {
          uVar2 = uVar1 + uVar6;
          *dest = pcVar4;
        }
      }
    }
    if (uVar2 == 0xffffffff) {
      vrna_message_warning("vrna_strcat_printf: memory allocation failure!");
      *dest = (char *)0x0;
    }
  }
  return uVar2;
}

Assistant:

PUBLIC int
vrna_strcat_vprintf(char        **dest,
                    const char  *format,
                    va_list     args)
{
  char    *buf;
  int     r, l1, l2;
  size_t  old_count, new_count;

  if ((!dest) || (!format))
    return -1;

  va_list copy;
  va_copy(copy, args);

  r         = -1;
  buf       = *dest;
  old_count = (buf) ? strlen(buf) : 0;

  /* retrieve the number of characters that the string requires */
#ifdef _WIN32
  /*
   * vsnprintf() in Windows is not ANSI compliant, although it's
   * "...included for compliance to the ANSI standard"
   * Thus, we use _vscprintf() that explicitly counts characters
   */
  new_count = _vscprintf(format, args);
#else
  new_count = vsnprintf(NULL, 0, format, args);
#endif

  /* determine longer and shorter part of new string for INT overflow protection */
  if (old_count > new_count) {
    l1  = old_count;
    l2  = new_count;
  } else {
    l1  = new_count;
    l2  = old_count;
  }

  if ((new_count > 0) && (l1 < SIZE_MAX) && ((SIZE_MAX - l1) > l2)) {
    buf = (char *)vrna_realloc(buf, sizeof(char) * (old_count + new_count + 1));
    if (buf == NULL) {
      r = -1;
    } else if ((r = vsnprintf(buf + old_count, new_count + 1, format, copy)) < 0) {
      free(buf);
    } else {
      *dest = buf;
      r     = old_count + new_count;
    }
  } else if (new_count == 0) {
    /* we do not treat empty format string as error */
    r = (int)old_count;
  }

  va_end(copy);  /* Each va_start() or va_copy() needs a va_end() */

  /* check for any memory allocation error indicated by r == -1 */
  if (r == -1) {
    vrna_message_warning("vrna_strcat_printf: memory allocation failure!");
    *dest = NULL;
  }

  return r;
}